

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall parser::memo::any::of<hwl::Statement>::~of(of<hwl::Statement> *this)

{
  ~of(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

of (const T& v) : v(v) {}